

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

MakeNet * __thiscall notch::core::MakeNet::addFC(MakeNet *this,size_t n,Activation *af)

{
  iterator __position;
  logic_error *this_00;
  MakeLayer mk;
  LayerType local_54;
  value_type local_50;
  
  checkConfig(this);
  if (n != 0) {
    local_50.nInputs = this->nOutputs;
    local_50.maybeWeights.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_50.maybeWeights.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_50.maybeBias.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_50.maybeBias.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_50.nOutputs = n;
    local_50.maybeActivation = af;
    std::vector<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>::push_back
              (&this->layerMakers,&local_50);
    local_54 = FC;
    __position._M_current =
         (this->layerTypes).
         super__Vector_base<notch::core::MakeNet::LayerType,_std::allocator<notch::core::MakeNet::LayerType>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->layerTypes).
        super__Vector_base<notch::core::MakeNet::LayerType,_std::allocator<notch::core::MakeNet::LayerType>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<notch::core::MakeNet::LayerType,_std::allocator<notch::core::MakeNet::LayerType>_>
      ::_M_realloc_insert<notch::core::MakeNet::LayerType>(&this->layerTypes,__position,&local_54);
    }
    else {
      *__position._M_current = FC;
      (this->layerTypes).
      super__Vector_base<notch::core::MakeNet::LayerType,_std::allocator<notch::core::MakeNet::LayerType>_>
      ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    this->nOutputs = n;
    if (local_50.maybeBias.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.maybeBias.
                 super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_50.maybeWeights.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.maybeWeights.
                 super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    return this;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  ::std::logic_error::logic_error(this_00,"cannot add a layer with zero outputs");
  __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
}

Assistant:

MakeNet &addFC(size_t n, const Activation &af = scaledTanh) {
        checkConfig();
        if (!n) {
            throw std::logic_error("cannot add a layer with zero outputs");
        }
        MakeLayer mk(nOutputs, n, af);
        layerMakers.push_back(mk);
        layerTypes.push_back(LayerType::FC);
        nOutputs = n;
        return *this;
    }